

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_merge_parent_children(lyd_node *target,lyd_node *source,int options)

{
  int iVar1;
  bool bVar2;
  long *local_80;
  lyd_node **trg_child_p;
  ly_ctx *ctx;
  int clear_flag;
  int ret;
  lyd_node *trg_parent_backup;
  lyd_node *trg_child;
  lyd_node *src_next;
  lyd_node *src_elem_backup;
  lyd_node *src_elem;
  lyd_node *src_backup;
  lyd_node *src;
  lyd_node *trg_parent;
  lyd_node *plStack_20;
  int options_local;
  lyd_node *source_local;
  lyd_node *target_local;
  
  ctx._0_4_ = 0;
  trg_child_p = (lyd_node **)target->schema->module->ctx;
  src_backup = source;
  trg_parent._4_4_ = options;
  plStack_20 = source;
  source_local = target;
  do {
    if (src_backup == (lyd_node *)0x0) {
      lyd_free_withsiblings(plStack_20);
      if ((int)ctx == 0) {
        target_local._4_4_ = 0;
      }
      else {
        target_local._4_4_ = 2;
      }
      return target_local._4_4_;
    }
    src_elem = src_backup->next;
    src = source_local;
    src_elem_backup = src_backup;
    while (trg_child = src_elem_backup, src_elem_backup != (lyd_node *)0x0) {
      if (((src_elem_backup->field_0x9 & 1) == 0) || ((trg_parent._4_4_ & 0x100) == 0)) {
        ctx._4_4_ = 0;
        if (src_elem_backup->hash == 0) {
          lyd_hash(src_elem_backup);
        }
        if (src->ht == (hash_table *)0x0) {
          for (trg_parent_backup = src->child; trg_parent_backup != (lyd_node *)0x0;
              trg_parent_backup = trg_parent_backup->next) {
            ctx._4_4_ = lyd_merge_node_schema_equal(trg_parent_backup,src_elem_backup);
            if (ctx._4_4_ == 1) {
              ctx._4_4_ = lyd_merge_node_equal(trg_parent_backup,src_elem_backup);
            }
            if (ctx._4_4_ != 0) break;
          }
        }
        else {
          trg_parent_backup = (lyd_node *)0x0;
          iVar1 = lyht_find(src->ht,&src_elem_backup,src_elem_backup->hash,&local_80);
          if (iVar1 == 0) {
            trg_parent_backup = (lyd_node *)*local_80;
            ctx._4_4_ = 1;
            if (((trg_parent_backup->schema->nodetype == LYS_LIST) &&
                (trg_parent_backup->schema->padding[2] == '\0')) ||
               ((trg_parent_backup->schema->nodetype == LYS_LEAFLIST &&
                ((trg_parent_backup->schema->flags & 2) != 0)))) {
              if ((trg_parent_backup->schema->flags & 2) == 0) {
                __assert_fail("trg_child->schema->flags & LYS_CONFIG_R",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0xacd,
                              "int lyd_merge_parent_children(struct lyd_node *, struct lyd_node *, int)"
                             );
              }
              while( true ) {
                bVar2 = false;
                if (trg_parent_backup != (lyd_node *)0x0) {
                  bVar2 = (trg_parent_backup->validity & 0x80) != 0;
                }
                if (!bVar2) break;
                iVar1 = lyht_find_next(src->ht,&trg_parent_backup,trg_parent_backup->hash,&local_80)
                ;
                if (iVar1 == 0) {
                  trg_parent_backup = (lyd_node *)*local_80;
                }
                else {
                  trg_parent_backup = (lyd_node *)0x0;
                }
              }
              if (trg_parent_backup == (lyd_node *)0x0) {
                ctx._4_4_ = 0;
              }
              else {
                trg_parent_backup->validity = trg_parent_backup->validity | 0x80;
                ctx._4_4_ = 2;
              }
            }
          }
        }
        if (ctx._4_4_ < 1) {
          if (ctx._4_4_ == -1) {
            lyd_free_withsiblings(plStack_20);
            return 1;
          }
        }
        else if ((trg_parent_backup->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) == LYS_UNKNOWN) {
          if (ctx._4_4_ == 2) {
            ctx._0_4_ = 1;
          }
        }
        else {
          lyd_merge_node_update(trg_parent_backup,src_elem_backup);
        }
        src_next = src_elem_backup;
        _clear_flag = src;
        if ((((src_elem_backup->schema->nodetype != LYS_CONTAINER) &&
             ((src_elem_backup->schema->nodetype != LYS_LIST ||
              (src_elem_backup->schema->padding[2] == '\0')))) ||
            (src_elem_backup->child == (lyd_node *)0x0)) || (trg_parent_backup == (lyd_node *)0x0))
        goto LAB_0019e380;
        trg_child = src_elem_backup->child;
        src = trg_parent_backup;
LAB_0019e3b0:
        while ((trg_child == (lyd_node *)0x0 &&
               (src_elem_backup = src_elem_backup->parent,
               src_elem_backup->parent != src_backup->parent))) {
          trg_child = src_elem_backup->next;
          src = src->parent;
        }
        if (trg_parent_backup == (lyd_node *)0x0) goto LAB_0019e407;
      }
      else {
        if (src_elem_backup == src_backup) break;
        trg_parent_backup = (lyd_node *)0x1;
LAB_0019e380:
        if (src_elem_backup != src_backup) {
          trg_child = src_elem_backup->next;
          goto LAB_0019e3b0;
        }
        if (trg_parent_backup != (lyd_node *)0x0) break;
        trg_child = (lyd_node *)0x0;
LAB_0019e407:
        if ((ly_ctx *)trg_child_p == src_next->schema->module->ctx) {
          lyd_unlink(src_next);
        }
        else {
          src_next = lyd_dup_to_ctx(src_next,1,(ly_ctx *)trg_child_p);
        }
        if (src_elem_backup == plStack_20) {
          plStack_20 = plStack_20->next;
        }
        iVar1 = lyd_insert(_clear_flag,src_next);
        if (iVar1 != 0) {
          ly_log((ly_ctx *)trg_child_p,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0xb36);
          lyd_free_withsiblings(plStack_20);
          return 1;
        }
        if (src_elem_backup == src_backup) break;
      }
      src_elem_backup = trg_child;
    }
    src_backup = src_elem;
  } while( true );
}

Assistant:

static int
lyd_merge_parent_children(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg_parent, *src, *src_backup, *src_elem, *src_elem_backup, *src_next, *trg_child, *trg_parent_backup;
    int ret, clear_flag = 0;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        for (src_elem = src_next = src, trg_parent = target;
            src_elem;
            src_elem = src_next) {

            /* it won't get inserted in this case */
            if (src_elem->dflt && (options & LYD_OPT_EXPLICIT)) {
                if (src_elem == src) {
                    /* we are done with this subtree in this case */
                    break;
                }
                trg_child = (struct lyd_node *)1;
                goto src_skip;
            }

            ret = 0;

#ifdef LY_ENABLED_CACHE
            struct lyd_node **trg_child_p;

            /* trees are supposed to be validated so all nodes must have their hash, but lets not be that strict */
            if (!src_elem->hash) {
                lyd_hash(src_elem);
            }

            if (trg_parent->ht) {
                trg_child = NULL;
                if (!lyht_find(trg_parent->ht, &src_elem, src_elem->hash, (void **)&trg_child_p)) {
                    trg_child = *trg_child_p;
                    ret = 1;

                    /* it is a bit more difficult with keyless state lists and leaf-lists */
                    if (((trg_child->schema->nodetype == LYS_LIST) && !((struct lys_node_list *)trg_child->schema)->keys_size)
                            || ((trg_child->schema->nodetype == LYS_LEAFLIST) && (trg_child->schema->flags & LYS_CONFIG_R))) {
                        assert(trg_child->schema->flags & LYS_CONFIG_R);

                        while (trg_child && (trg_child->validity & LYD_VAL_INUSE)) {
                            /* state lists, find one not-already-found */
                            if (lyht_find_next(trg_parent->ht, &trg_child, trg_child->hash, (void **)&trg_child_p)) {
                                trg_child = NULL;
                            } else {
                                trg_child = *trg_child_p;
                            }
                        }
                        if (trg_child) {
                            /* mark it as matched */
                            trg_child->validity |= LYD_VAL_INUSE;
                            ret = 2;
                        } else {
                            /* actually, it was matched already and no other instance found, so now not a match */
                            ret = 0;
                        }
                    }
                }
            } else
#endif
            {
                LY_TREE_FOR(trg_parent->child, trg_child) {
                    /* schema match, data match? */
                    ret = lyd_merge_node_schema_equal(trg_child, src_elem);
                    if (ret == 1) {
                        ret = lyd_merge_node_equal(trg_child, src_elem);
                    }
                    if (ret != 0) {
                        /* even data match */
                        break;
                    }
                }
            }

            if (ret > 0) {
                if (trg_child->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) {
                    lyd_merge_node_update(trg_child, src_elem);
                } else if (ret == 2) {
                    clear_flag = 1;
                }
            } else if (ret == -1) {
                /* error */
                lyd_free_withsiblings(source);
                return 1;
            }

            /* first prepare for the next iteration */
            src_elem_backup = src_elem;
            trg_parent_backup = trg_parent;
            if (((src_elem->schema->nodetype == LYS_CONTAINER) || ((src_elem->schema->nodetype == LYS_LIST)
                    && ((struct lys_node_list *)src_elem->schema)->keys_size)) && src_elem->child && trg_child) {
                /* go into children */
                src_next = src_elem->child;
                trg_parent = trg_child;
            } else {
src_skip:
                /* no children (or the whole subtree will be inserted), try siblings */
                if (src_elem == src) {
                    /* we are done with this subtree */
                    if (trg_child) {
                        /* it's an empty container, list without keys, or an already-updated leaf/anydata, nothing else to do */
                        break;
                    } else {
                        /* ... but we still need to insert it */
                        src_next = NULL;
                        goto src_insert;
                    }
                } else {
                    src_next = src_elem->next;
                    /* trg_parent does not change */
                }
            }
            while (!src_next) {
                src_elem = src_elem->parent;
                if (src_elem->parent == src->parent) {
                    /* we are done, no next element to process */
                    break;
                }

                /* parent is already processed, go to its sibling */
                src_next = src_elem->next;
                trg_parent = trg_parent->parent;
            }

            if (!trg_child) {
src_insert:
                /* we need to insert the whole subtree */
                if (ctx == src_elem_backup->schema->module->ctx) {
                    /* same context - unlink the subtree and insert it into the target */
                    lyd_unlink(src_elem_backup);
                } else {
                    /* different contexts - before inserting subtree, instead of unlinking, duplicate it into the
                     * target context */
                    src_elem_backup = lyd_dup_to_ctx(src_elem_backup, 1, ctx);
                }

                if (src_elem == source) {
                    /* it will be linked into another data tree and the pointers changed */
                    source = source->next;
                }

                /* insert subtree into the target */
                if (lyd_insert(trg_parent_backup, src_elem_backup)) {
                    LOGINT(ctx);
                    lyd_free_withsiblings(source);
                    return 1;
                }
                if (src_elem == src) {
                    /* we are finished for this src */
                    break;
                }
            }
        }
    }

    lyd_free_withsiblings(source);
    if (clear_flag) {
        return 2;
    }
    return 0;
}